

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O2

void Imath_3_2::affineTransform<float,float>
               (Box<Imath_3_2::Vec3<float>_> *box,Matrix44<float> *m,
               Box<Imath_3_2::Vec3<float>_> *result)

{
  bool bVar1;
  int i;
  long lVar2;
  float *pfVar3;
  long lVar4;
  float fVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  bVar1 = Box<Imath_3_2::Vec3<float>_>::isEmpty(box);
  if (bVar1) {
    uVar6 = 0xff7fffff7f7fffff;
  }
  else {
    bVar1 = Box<Imath_3_2::Vec3<float>_>::isInfinite(box);
    if (!bVar1) {
      pfVar3 = (float *)m;
      for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
        fVar7 = m->x[3][lVar2];
        (&(result->max).x)[lVar2] = fVar7;
        (&(result->min).x)[lVar2] = fVar7;
        fVar5 = fVar7;
        for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 4) {
          fVar9 = *(float *)((long)&(box->min).x + lVar4) * pfVar3[lVar4];
          fVar8 = pfVar3[lVar4] * *(float *)((long)&(box->max).x + lVar4);
          fVar10 = fVar9;
          if (fVar8 <= fVar9) {
            fVar10 = fVar8;
          }
          fVar5 = fVar5 + fVar10;
          if (fVar8 <= fVar9) {
            fVar8 = fVar9;
          }
          fVar7 = fVar7 + fVar8;
          (&(result->min).x)[lVar2] = fVar5;
          (&(result->max).x)[lVar2] = fVar7;
        }
        pfVar3 = pfVar3 + 1;
      }
      return;
    }
    uVar6 = 0x7f7fffffff7fffff;
  }
  fVar7 = (float)uVar6;
  fVar5 = (float)((ulong)uVar6 >> 0x20);
  (result->min).x = fVar7;
  (result->min).y = fVar7;
  (result->min).z = fVar7;
  (result->max).x = fVar5;
  (result->max).y = fVar5;
  (result->max).z = fVar5;
  return;
}

Assistant:

IMATH_HOSTDEVICE void
affineTransform (
    const Box<Vec3<S>>& box,
    const Matrix44<T>&  m,
    Box<Vec3<S>>&       result) IMATH_NOEXCEPT
{
    if (box.isEmpty ())
    {
        result.makeEmpty ();
        return;
    }

    if (box.isInfinite ())
    {
        result.makeInfinite ();
        return;
    }

    for (int i = 0; i < 3; i++)
    {
        result.min[i] = result.max[i] = (S) m[3][i];

        for (int j = 0; j < 3; j++)
        {
            S a, b;

            a = (S) m[j][i] * box.min[j];
            b = (S) m[j][i] * box.max[j];

            if (a < b)
            {
                result.min[i] += a;
                result.max[i] += b;
            }
            else
            {
                result.min[i] += b;
                result.max[i] += a;
            }
        }
    }
}